

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_widget.c
# Opt level: O3

void text_widget_layer_update(ugui_layer_t *layer,void *graphics_ctx,void *layer_ctx)

{
  char cVar1;
  ushort uVar2;
  ushort uVar3;
  uint uVar4;
  uint16_t uVar5;
  uint16_t uVar6;
  ushort uVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  ugui_rect_t *puVar11;
  size_t sVar12;
  ugui_point_t point;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  char local_a8 [8];
  uint8_t line_buff [64];
  int local_58;
  ugui_size_t local_40;
  uint local_3c;
  ugui_size_t text_size;
  
  line_buff._56_8_ = graphics_ctx;
  puVar11 = ugui_layer_get_bounds(layer);
  ugui_font_get_text_size(*(font_style_t **)((long)layer_ctx + 8),"A",&local_40);
  uVar6 = local_40.h;
  uVar5 = local_40.w;
  uVar2 = puVar11->w;
  uVar3 = puVar11->h;
  uVar7 = uVar2 / local_40.w;
  uVar4 = (uint)local_40.h;
  sVar12 = strlen(*(char **)((long)layer_ctx + 0x18));
  local_3c = (uint)sVar12 & 0xffff;
  if (uVar6 <= uVar3 && (sVar12 & 0xffff) != 0) {
    uVar15 = 0;
    uVar10 = 0;
    uVar16 = 0;
    uVar14 = 0;
    text_size.w = 0;
    text_size.h = 0;
    do {
      uVar17 = (ulong)uVar10;
      if (uVar5 <= uVar2) {
        uVar8 = local_3c - uVar10;
        if (local_3c < uVar10) {
          uVar8 = 0;
        }
        uVar13 = 0;
        do {
          if ((sVar12 & 0xffff) <= uVar17 + uVar13) {
            uVar14 = (ulong)uVar8;
            break;
          }
          cVar1 = *(char *)(uVar13 + *(long *)((long)layer_ctx + 0x18) + uVar17);
          if (cVar1 == ' ') {
            uVar14 = uVar13 & 0xffffffff;
          }
          else if (cVar1 == '\n') {
            uVar14 = uVar13 & 0xffffffff;
            break;
          }
          uVar13 = uVar13 + 1;
        } while (uVar13 < uVar7);
      }
      uVar13 = uVar14 & 0xffff;
      strncpy(local_a8,(char *)(*(long *)((long)layer_ctx + 0x18) + uVar17),uVar13);
      local_a8[uVar13] = '\0';
      cVar1 = *(char *)((long)layer_ctx + 0x10);
      local_58 = (int)uVar14;
      if (cVar1 == '\x02') {
        text_size = (ugui_size_t)((uint)uVar7 - local_58);
      }
      else if (cVar1 == '\x01') {
        iVar9 = (uint)uVar7 - (int)uVar13;
        text_size = (ugui_size_t)((uint)(iVar9 - (iVar9 >> 0x1f)) >> 1);
      }
      else if (cVar1 == '\0') {
        text_size.w = 0;
        text_size.h = 0;
      }
      point.y = (short)uVar16 * local_40.h;
      point.x = local_40.w * text_size.w;
      ugui_graphics_draw_text
                ((ugui_graphics_t *)line_buff._56_8_,local_a8,
                 *(font_style_t **)((long)layer_ctx + 8),point);
      uVar10 = uVar10 + local_58 + 1 & 0xffff;
      if (local_3c <= uVar10) {
        return;
      }
      uVar16 = uVar15 + 1;
      uVar15 = uVar16 & 0xffff;
    } while (uVar15 < uVar3 / uVar4);
  }
  return;
}

Assistant:

static void text_widget_layer_update(ugui_layer_t* layer, void* graphics_ctx, void* layer_ctx)
{
    ugui_text_widget_t* text_widget = (ugui_text_widget_t*) layer_ctx;
    ugui_rect_t* bounds = ugui_layer_get_bounds(layer);

    uint8_t line_buff[64];

    ugui_size_t text_size;
    // TODO: dirty hack will only support monospace fonts
    ugui_font_get_text_size(text_widget->font,
                            "A",
                            &text_size);

    uint16_t max_text_width = bounds->w / text_size.w;
    uint16_t max_text_lines = bounds->h / text_size.h;

    uint16_t len = strlen(text_widget->text);

    uint16_t line_index = 0;
    uint16_t line_count = 0;
    uint16_t offset = 0;
    uint16_t alignment_offset = 0;

    while ((offset < len) && (line_index < max_text_lines)) {

        // Determine line length
        for (int i = 0; i < max_text_width; i++) {
            // Handle end of text
            if ((offset + i) >= len) {
                line_count = i;
                break;
            }

            // Handle newlines
            if (text_widget->text[offset + i] == '\n') {
                line_count = i;
                break;
            }

            // Insert linebreaks up to spaces.
            if (text_widget->text[offset + i] == ' ') {
                line_count = i;
            }
        }

        // Copy line into line buffer for rendering
        strncpy(line_buff, text_widget->text + offset, line_count);
        line_buff[line_count] = '\0';

        // Calculate offset for alignment modes
        switch (text_widget->alignment) {
        case UGUI_TEXT_ALIGN_LEFT:
            alignment_offset = 0;
            break;
        case UGUI_TEXT_ALIGN_CENTER:
            alignment_offset = (max_text_width - line_count) / 2;
            break;
        case UGUI_TEXT_ALIGN_RIGHT:
            alignment_offset = (max_text_width - line_count);
            break;
        }

        ugui_graphics_draw_text(graphics_ctx,
                                line_buff,
                                text_widget->font,
        (ugui_point_t) {
            .x = alignment_offset * text_size.w, .y = line_index * text_size.h
        });

        offset += line_count + 1;
        line_index += 1;
    }
}